

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall cli::Parser::~Parser(Parser *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  CmdBase *pCVar3;
  long lVar4;
  
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; (long)ppCVar1 - (long)ppCVar2 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    pCVar3 = (this->_commands).
             super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4];
    if (pCVar3 != (CmdBase *)0x0) {
      (*pCVar3->_vptr_CmdBase[1])();
    }
  }
  std::_Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::~_Vector_base
            (&(this->_commands).
              super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_arguments);
  std::__cxx11::string::~string((string *)&this->_general_help_text);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Parser() {
			for (size_t i = 0, n = _commands.size(); i < n; ++i) {
				delete _commands[i];
			}
		}